

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void DrawTextureTiled(Texture2D texture,Rectangle source,Rectangle dest,Vector2 origin,
                     float rotation,float scale,Color tint)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar18;
  Rectangle source_00;
  Rectangle source_01;
  Rectangle source_02;
  Rectangle source_03;
  Rectangle source_04;
  Rectangle dest_00;
  Rectangle dest_01;
  Rectangle dest_02;
  Rectangle dest_03;
  Rectangle dest_04;
  Rectangle dest_05;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined1 auStack_e4 [12];
  float local_d8;
  float fStack_d4;
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  
  auVar10._8_4_ = in_XMM3_Dc;
  auVar10._0_8_ = dest._8_8_;
  auVar10._12_4_ = in_XMM3_Dd;
  uVar1 = source._0_8_;
  if (scale <= 0.0) {
    return;
  }
  if (texture.id == 0) {
    return;
  }
  fVar16 = dest.width;
  fVar17 = dest.height;
  local_f8._0_4_ = source.width;
  local_f8._4_4_ = source.height;
  fStack_f0 = source.width;
  fStack_ec = source.height;
  iVar6 = (int)(scale * local_f8._4_4_);
  fVar18 = (float)(int)((float)local_f8 * scale);
  fVar8 = (float)iVar6;
  local_d8 = dest.x;
  fStack_d4 = dest.y;
  fVar9 = local_d8;
  if ((fVar18 <= fVar16) || (fVar8 <= fVar17)) {
    if (fVar16 <= fVar18) {
      local_f8._0_4_ = (fVar16 / fVar18) * (float)local_f8;
      iVar4 = 0;
      while( true ) {
        fVar18 = (float)iVar4;
        iVar4 = iVar4 + iVar6;
        fVar7 = fStack_d4 + fVar18;
        if (fVar17 <= (float)iVar4) break;
        dest_02.height = fVar8;
        dest_02.width = fVar16;
        source_01.width = (float)local_f8;
        source_01.height = local_f8._4_4_;
        source_01.x = (float)(int)uVar1;
        source_01.y = (float)(int)((ulong)uVar1 >> 0x20);
        dest_02.y = fStack_d4 + fVar18;
        dest_02.x = local_d8;
        DrawTexturePro(texture,source_01,dest_02,origin,rotation,tint);
      }
    }
    else {
      iVar4 = (int)((float)local_f8 * scale);
      auStack_e4 = auVar10._4_12_;
      if (fVar17 <= fVar8) {
        fVar8 = local_f8._4_4_ * (fVar17 / fVar8);
        iVar6 = 0;
        while( true ) {
          fVar7 = (float)iVar6;
          iVar6 = iVar6 + iVar4;
          fVar9 = local_d8 + fVar7;
          if (fVar16 <= (float)iVar6) break;
          source_02.height = fVar8;
          source_02.width = (float)local_f8;
          dest_03.height = fVar17;
          dest_03.width = fVar18;
          source_02.x = (float)(int)uVar1;
          source_02.y = (float)(int)((ulong)uVar1 >> 0x20);
          dest_03.y = fStack_d4;
          dest_03.x = fVar9;
          DrawTexturePro(texture,source_02,dest_03,origin,rotation,tint);
        }
        if (fVar16 <= fVar7) {
          return;
        }
        fVar16 = fVar16 - fVar7;
        auVar13._0_4_ = (fVar16 / fVar18) * (float)local_f8;
        auVar13._4_12_ = auStack_e4;
        auVar15._0_8_ = auVar13._0_8_;
        auVar15._8_4_ = fVar17;
        auVar15._12_4_ = in_XMM3_Dd;
        auVar14._8_8_ = auVar15._8_8_;
        auVar14._4_4_ = fVar8;
        auVar14._0_4_ = auVar13._0_4_;
        auVar11._0_12_ = auVar14._0_12_;
        auVar11._12_4_ = local_f8._4_4_;
        goto LAB_0013a4b4;
      }
      iVar3 = 0;
      while( true ) {
        fVar7 = (float)iVar3;
        iVar3 = iVar3 + iVar4;
        fVar9 = local_d8 + fVar7;
        if (fVar16 <= (float)iVar3) break;
        iVar5 = 0;
        while( true ) {
          fVar7 = (float)iVar5;
          iVar5 = iVar5 + iVar6;
          if (fVar17 <= (float)iVar5) break;
          dest_00.height = fVar8;
          dest_00.width = fVar18;
          dest_00.y = fStack_d4 + fVar7;
          dest_00.x = fVar9;
          DrawTexturePro(texture,source,dest_00,origin,rotation,tint);
        }
        if (fVar7 < fVar17) {
          source_00.height = ((fVar17 - fVar7) / fVar8) * local_f8._4_4_;
          source_00.width = (float)local_f8;
          source_00.x = (float)(int)uVar1;
          source_00.y = (float)(int)((ulong)uVar1 >> 0x20);
          dest_01.y = fStack_d4 + fVar7;
          dest_01.x = fVar9;
          dest_01.height = fVar17 - fVar7;
          dest_01.width = fVar18;
          DrawTexturePro(texture,source_00,dest_01,origin,rotation,tint);
        }
      }
      if (fVar16 <= fVar7) {
        return;
      }
      fVar16 = fVar16 - fVar7;
      local_f8._0_4_ = (fVar16 / fVar18) * (float)local_f8;
      iVar4 = 0;
      while( true ) {
        fVar18 = (float)iVar4;
        iVar4 = iVar4 + iVar6;
        fVar7 = fStack_d4 + fVar18;
        if (fVar17 <= (float)iVar4) break;
        dest_04.height = fVar8;
        dest_04.width = fVar16;
        source_03.width = (float)local_f8;
        source_03.height = local_f8._4_4_;
        source_03.x = (float)(int)uVar1;
        source_03.y = (float)(int)((ulong)uVar1 >> 0x20);
        dest_04.y = fStack_d4 + fVar18;
        dest_04.x = fVar9;
        DrawTexturePro(texture,source_03,dest_04,origin,rotation,tint);
      }
    }
    fStack_d4 = fVar7;
    if (fVar17 <= fVar18) {
      return;
    }
    auVar12._4_4_ = fVar17;
    auVar12._0_4_ = (float)local_f8;
    auVar12._8_4_ = fVar17;
    auVar12._12_4_ = local_f8._4_4_;
    auVar11._8_8_ = auVar12._8_8_;
    auVar11._4_4_ = local_f8._4_4_ * ((fVar17 - fVar18) / fVar8);
    auVar11._0_4_ = (float)local_f8;
    fVar17 = fVar17 - fVar18;
  }
  else {
    auVar2._4_4_ = fVar8;
    auVar2._0_4_ = fVar18;
    auVar2._8_4_ = (float)(int)local_f8._4_4_;
    auVar2._12_4_ = (int)local_f8._4_4_;
    auVar10 = divps(auVar10,auVar2);
    auVar11._0_4_ = auVar10._0_4_ * (float)local_f8;
    auVar11._4_4_ = auVar10._4_4_ * local_f8._4_4_;
    auVar11._8_4_ = auVar10._8_4_ * fStack_f0;
    auVar11._12_4_ = auVar10._12_4_ * fStack_ec;
  }
LAB_0013a4b4:
  source_04._8_8_ = auVar11._0_8_;
  source_04.x = (float)(int)uVar1;
  source_04.y = (float)(int)((ulong)uVar1 >> 0x20);
  dest_05.y = fStack_d4;
  dest_05.x = fVar9;
  dest_05.height = fVar17;
  dest_05.width = fVar16;
  DrawTexturePro(texture,source_04,dest_05,origin,rotation,tint);
  return;
}

Assistant:

void DrawTextureTiled(Texture2D texture, Rectangle source, Rectangle dest, Vector2 origin, float rotation, float scale, Color tint)
{
    if ((texture.id <= 0) || (scale <= 0.0f)) return;  // Wanna see a infinite loop?!...just delete this line!

    int tileWidth = (int)(source.width*scale), tileHeight = (int)(source.height*scale);
    if ((dest.width < tileWidth) && (dest.height < tileHeight))
    {
        // Can fit only one tile
        DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, ((float)dest.height/tileHeight)*source.height},
                    (Rectangle){dest.x, dest.y, dest.width, dest.height}, origin, rotation, tint);
    }
    else if (dest.width <= tileWidth)
    {
        // Tiled vertically (one column)
        int dy = 0;
        for (;dy+tileHeight < dest.height; dy += tileHeight)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, source.height}, (Rectangle){dest.x, dest.y + dy, dest.width, (float)tileHeight}, origin, rotation, tint);
        }

        // Fit last tile
        if (dy < dest.height)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                        (Rectangle){dest.x, dest.y + dy, dest.width, dest.height - dy}, origin, rotation, tint);
        }
    }
    else if (dest.height <= tileHeight)
    {
        // Tiled horizontally (one row)
        int dx = 0;
        for (;dx+tileWidth < dest.width; dx += tileWidth)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, source.width, ((float)dest.height/tileHeight)*source.height}, (Rectangle){dest.x + dx, dest.y, (float)tileWidth, dest.height}, origin, rotation, tint);
        }

        // Fit last tile
        if (dx < dest.width)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, ((float)dest.height/tileHeight)*source.height},
                        (Rectangle){dest.x + dx, dest.y, dest.width - dx, dest.height}, origin, rotation, tint);
        }
    }
    else
    {
        // Tiled both horizontally and vertically (rows and columns)
        int dx = 0;
        for (;dx+tileWidth < dest.width; dx += tileWidth)
        {
            int dy = 0;
            for (;dy+tileHeight < dest.height; dy += tileHeight)
            {
                DrawTexturePro(texture, source, (Rectangle){dest.x + dx, dest.y + dy, (float)tileWidth, (float)tileHeight}, origin, rotation, tint);
            }

            if (dy < dest.height)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                    (Rectangle){dest.x + dx, dest.y + dy, (float)tileWidth, dest.height - dy}, origin, rotation, tint);
            }
        }

        // Fit last column of tiles
        if (dx < dest.width)
        {
            int dy = 0;
            for (;dy+tileHeight < dest.height; dy += tileHeight)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, source.height},
                        (Rectangle){dest.x + dx, dest.y + dy, dest.width - dx, (float)tileHeight}, origin, rotation, tint);
            }

            // Draw final tile in the bottom right corner
            if (dy < dest.height)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                    (Rectangle){dest.x + dx, dest.y + dy, dest.width - dx, dest.height - dy}, origin, rotation, tint);
            }
        }
    }
}